

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall Js::FunctionBody::CleanupToReparseHelper(FunctionBody *this)

{
  uint uVar1;
  SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *pSVar2;
  JavascriptMethod originalEntryPoint;
  SourceContextInfo *pSVar3;
  SourceDynamicProfileManager *this_00;
  SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *pSVar4;
  SmallSpanSequence *obj;
  AuxStatementData *candidate;
  code *pcVar5;
  bool bVar6;
  BOOL BVar7;
  undefined4 *puVar8;
  FunctionEntryPointInfo *pFVar9;
  Type *pTVar10;
  FunctionBody *pFVar11;
  long lVar12;
  undefined1 local_38 [8];
  EditingIterator iter;
  
  CleanupRecyclerData(this,false,true);
  pSVar2 = (this->entryPoints).ptr;
  lVar12 = (long)(pSVar2->
                 super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ).
                 super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                 .count;
  if (lVar12 != 0) {
    memset((pSVar2->
           super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           ).
           super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
           .buffer.ptr,0,lVar12 << 3);
    (pSVar2->
    super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ).
    super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
    .count = 0;
  }
  CreateNewDefaultEntryPoint(this);
  originalEntryPoint =
       ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->CurrentThunk;
  if ((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4e3,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar6) goto LAB_00775811;
    *puVar8 = 0;
  }
  if ((FunctionBody *)
      (((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->functionBodyImpl)
      .ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4e4,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar6) goto LAB_00775811;
    *puVar8 = 0;
  }
  FunctionInfo::SetOriginalEntryPoint
            ((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr,
             originalEntryPoint);
  if ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_defaultEntryPointInfo.ptr !=
      (ProxyEntryPointInfo *)0x0) {
    pFVar9 = GetDefaultFunctionEntryPointInfo(this);
    pFVar9->entryPointIndex = 0;
  }
  FunctionProxy::SetAuxPtr((FunctionProxy *)this,AuxBlock,(void *)0x0);
  FunctionProxy::SetAuxPtr((FunctionProxy *)this,AuxContextBlock,(void *)0x0);
  if (((this->byteCodeBlock).ptr != (ByteBlock *)0x0) &&
     (((this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 8) != 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1425,"(!this->byteCodeBlock || !this->IsWasmFunction())",
                                "We should never reset the bytecode block for Wasm");
    if (!bVar6) goto LAB_00775811;
    *puVar8 = 0;
  }
  (this->byteCodeBlock).ptr = (ByteBlock *)0x0;
  FunctionProxy::SetAuxPtr((FunctionProxy *)this,LoopHeaderArray,(void *)0x0);
  Memory::Recycler::WBSetBit((char *)&this->m_constTable);
  (this->m_constTable).ptr = (WriteBarrierPtr<void> *)0x0;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->m_constTable);
  FunctionProxy::SetAuxPtr((FunctionProxy *)this,CodeGenRuntimeData,(void *)0x0);
  (this->cacheIdToPropertyIdMap).ptr = (int *)0x0;
  FunctionProxy::SetAuxPtr((FunctionProxy *)this,FormalsPropIdArray,(void *)0x0);
  FunctionProxy::SetAuxPtr((FunctionProxy *)this,ReferencedPropertyIdMap,(void *)0x0);
  FunctionProxy::SetAuxPtr((FunctionProxy *)this,CallSiteToCallApplyCallSiteArray,(void *)0x0);
  FunctionProxy::SetAuxPtr((FunctionProxy *)this,LiteralRegexes,(void *)0x0);
  FunctionProxy::SetAuxPtr((FunctionProxy *)this,SlotIdInCachedScopeToNestedIndexArray,(void *)0x0);
  FunctionProxy::SetAuxPtr((FunctionProxy *)this,StatementMaps,(void *)0x0);
  FunctionProxy::SetAuxPtr((FunctionProxy *)this,CodeGenGetSetRuntimeData,(void *)0x0);
  FunctionProxy::SetAuxPtr((FunctionProxy *)this,PropertyIdOnRegSlotsContainer,(void *)0x0);
  this->profiledLdLenCount = 0;
  this->profiledLdElemCount = 0;
  this->profiledStElemCount = 0;
  this->profiledCallSiteCount = 0;
  this->profiledArrayCallSiteCount = 0;
  this->profiledDivOrRemCount = 0;
  this->profiledSwitchCount = 0;
  this->profiledReturnTypeCount = 0;
  this->profiledSlotCount = 0;
  SetCountField(this,LoopCount,0);
  this->m_envDepth = 0xffff;
  SetCountField(this,ByteCodeCount,0);
  SetCountField(this,ByteCodeWithoutLDACount,0);
  SetCountField(this,ByteCodeInLoopCount,0);
  if ((this->dynamicProfileInfo).ptr != (DynamicProfileInfo *)0x0) {
    pSVar3 = (((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
               m_srcInfo).ptr)->sourceContextInfo).ptr;
    if ((pSVar3 != (SourceContextInfo *)0x0) &&
       (this_00 = (pSVar3->sourceDynamicProfileManager).ptr,
       this_00 != (SourceDynamicProfileManager *)0x0)) {
      SourceDynamicProfileManager::RemoveDynamicProfileInfo
                (this_00,((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)
                         ->functionId);
    }
    pSVar4 = (((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
               super_ScriptContextBase).javascriptLibrary)->cache).profileInfoList.ptr;
    if (pSVar4 != (SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *)0x0) {
      iter.super_Iterator.current = (NodeBase *)0x0;
      local_38 = (undefined1  [8])pSVar4;
      iter.super_Iterator.list = pSVar4;
      bVar6 = SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount>::EditingIterator::
              Next((EditingIterator *)local_38);
      if (bVar6) {
        do {
          pTVar10 = SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount>::Iterator::Data
                              ((Iterator *)local_38);
          if ((pTVar10->ptr->hasFunctionBody == true) &&
             (pFVar11 = DynamicProfileInfo::GetFunctionBody(pTVar10->ptr), pFVar11 == this)) {
            SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount>::EditingIterator::
            UnlinkCurrentNode((EditingIterator *)local_38);
            break;
          }
          bVar6 = SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount>::EditingIterator
                  ::Next((EditingIterator *)local_38);
        } while (bVar6);
      }
    }
    (this->dynamicProfileInfo).ptr = (DynamicProfileInfo *)0x0;
  }
  this->field_0x179 = this->field_0x179 & 0xfe;
  this->field_0x17d = this->field_0x17d & 0xfe;
  SetCountField(this,VarCount,0);
  SetCountField(this,ConstantCount,0);
  this->field_0x17c = this->field_0x17c & 1;
  SetCountField(this,InnerScopeCount,0);
  this->hasCachedScopePropIds = false;
  FunctionProxy::SetAuxPtr((FunctionProxy *)this,ObjLiteralTypes,(void *)0x0);
  SetCountField(this,ObjLiteralCount,0);
  SetCountField(this,InlineCacheCount,0);
  SetCountField(this,RootObjectLoadInlineCacheStart,0);
  SetCountField(this,RootObjectLoadMethodInlineCacheStart,0);
  SetCountField(this,RootObjectStoreInlineCacheStart,0);
  SetCountField(this,IsInstInlineCacheCount,0);
  this->field_0x17a = this->field_0x17a & 0xf7;
  SetCountField(this,ReferencedPropertyIdCount,0);
  FunctionProxy::SetAuxPtr((FunctionProxy *)this,PolymorphicCallSiteInfoHead,(void *)0x0);
  (this->executionState).interpretedCount = 0;
  uVar1 = *(uint *)&this->field_0x178;
  this->debuggerScopeIndex = 0;
  this->m_asmJsTotalLoopCount = 0;
  *(uint *)&this->field_0x178 = uVar1 & 0x77fdffff;
  this->loopInterpreterLimit = DAT_015b8ee8;
  *(uint *)&this->field_0x178 = uVar1 & 0x77fd7fff;
  FunctionExecutionStateMachine::ReinitializeExecutionModeAndLimits(&this->executionState,this);
  if ((this->m_sourceInfo).m_probeCount != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x148b,"(this->m_sourceInfo.m_probeCount == 0)",
                                "this->m_sourceInfo.m_probeCount == 0");
    if (!bVar6) goto LAB_00775811;
    *puVar8 = 0;
  }
  (this->m_sourceInfo).m_probeBackingBlock.ptr = (ByteBlock *)0x0;
  this->m_DEBUG_executionCount = 0;
  obj = (this->m_sourceInfo).pSpanSequence;
  if (obj != (SmallSpanSequence *)0x0) {
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Js::SmallSpanSequence>
              (&Memory::HeapAllocator::Instance,obj);
    (this->m_sourceInfo).pSpanSequence = (Type)0x0;
  }
  candidate = (this->m_sourceInfo).m_auxStatementData.ptr;
  if (candidate != (AuxStatementData *)0x0) {
    BVar7 = Memory::Recycler::IsValidObject
                      (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                       recycler,candidate,0);
    if (BVar7 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x149c,
                                  "(m_scriptContext->GetRecycler()->IsValidObject(m_sourceInfo.m_auxStatementData))"
                                  ,
                                  "m_scriptContext->GetRecycler()->IsValidObject(m_sourceInfo.m_auxStatementData)"
                                 );
      if (!bVar6) {
LAB_00775811:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar8 = 0;
    }
    (this->m_sourceInfo).m_auxStatementData.ptr = (AuxStatementData *)0x0;
  }
  return;
}

Assistant:

void FunctionBody::CleanupToReparseHelper()
    {
        this->CleanupRecyclerData(/* isShutdown */ false, true /* capture entry point cleanup stack trace */);

        this->entryPoints->ClearAndZero();

        // Store the originalEntryPoint to restore it back immediately.
        this->CreateNewDefaultEntryPoint();
        this->SetOriginalEntryPoint(this->GetScriptContext()->CurrentThunk);
        if (this->m_defaultEntryPointInfo)
        {
            this->GetDefaultFunctionEntryPointInfo()->entryPointIndex = 0;
        }

        this->SetAuxiliaryData(nullptr);
        this->SetAuxiliaryContextData(nullptr);
        AssertMsg(!this->byteCodeBlock || !this->IsWasmFunction(), "We should never reset the bytecode block for Wasm");
        this->byteCodeBlock = nullptr;
        this->SetLoopHeaderArray(nullptr);
        this->SetConstTable(nullptr);
        this->SetCodeGenRuntimeData(nullptr);
        this->cacheIdToPropertyIdMap = nullptr;
        this->SetFormalsPropIdArray(nullptr);
        this->SetReferencedPropertyIdMap(nullptr);
#if ENABLE_NATIVE_CODEGEN
        this->SetCallSiteToCallApplyCallSiteArray(nullptr);
#endif
        this->SetLiteralRegexs(nullptr);
        this->SetSlotIdInCachedScopeToNestedIndexArray(nullptr);
        this->SetStatementMaps(nullptr);
        this->SetCodeGenGetSetRuntimeData(nullptr);
        this->SetPropertyIdOnRegSlotsContainer(nullptr);
        this->profiledLdLenCount = 0;
        this->profiledLdElemCount = 0;
        this->profiledStElemCount = 0;
        this->profiledCallSiteCount = 0;
        this->profiledArrayCallSiteCount = 0;
        this->profiledDivOrRemCount = 0;
        this->profiledSwitchCount = 0;
        this->profiledReturnTypeCount = 0;
        this->profiledSlotCount = 0;
        this->SetLoopCount(0);

        this->m_envDepth = (uint16)-1;

        this->SetByteCodeCount(0);
        this->SetByteCodeWithoutLDACount(0);
        this->SetByteCodeInLoopCount(0);

#if ENABLE_PROFILE_INFO
        if (this->dynamicProfileInfo != nullptr)
        {
            SourceContextInfo * sourceContextInfo = GetSourceContextInfo();
            if(sourceContextInfo && sourceContextInfo->sourceDynamicProfileManager)
            {
                sourceContextInfo->sourceDynamicProfileManager->RemoveDynamicProfileInfo(GetFunctionInfo()->GetLocalFunctionId());
            }

#ifdef DYNAMIC_PROFILE_STORAGE
            DynamicProfileInfoList * profileInfoList = GetScriptContext()->GetProfileInfoList();
            if (profileInfoList)
            {
                FOREACH_SLISTBASE_ENTRY_EDITING(Field(DynamicProfileInfo*), info, profileInfoList, iter)
                {
                    if (info->HasFunctionBody() && info->GetFunctionBody() == this)
                    {
                        iter.UnlinkCurrent();
                        break;
                    }
                }
                NEXT_SLISTBASE_ENTRY_EDITING;
            }
#endif
        this->dynamicProfileInfo = nullptr;
        }
#endif
        this->hasExecutionDynamicProfileInfo = false;

        this->SetFirstTmpRegister(Constants::NoRegister);
        this->SetVarCount(0);
        this->SetConstantCount(0);
        this->SetLocalClosureRegister(Constants::NoRegister);
        this->SetParamClosureRegister(Constants::NoRegister);
        this->SetLocalFrameDisplayRegister(Constants::NoRegister);
        this->SetEnvRegister(Constants::NoRegister);
        this->SetThisRegisterForEventHandler(Constants::NoRegister);
        this->SetFirstInnerScopeRegister(Constants::NoRegister);
        this->SetFuncExprScopeRegister(Constants::NoRegister);
        this->SetInnerScopeCount(0);
        this->hasCachedScopePropIds = false;

        this->ResetObjectLiteralTypes();

        this->SetInlineCacheCount(0);
        this->SetRootObjectLoadInlineCacheStart(0);
        this->SetRootObjectLoadMethodInlineCacheStart(0);
        this->SetRootObjectStoreInlineCacheStart(0);
        this->SetIsInstInlineCacheCount(0);
        this->m_inlineCachesOnFunctionObject = false;
        this->SetReferencedPropertyIdCount(0);
#if ENABLE_PROFILE_INFO
        this->SetPolymorphicCallSiteInfoHead(nullptr);
#endif

        this->executionState.SetInterpretedCount(0);

        this->m_hasDoneAllNonLocalReferenced = false;

        this->SetDebuggerScopeIndex(0);

        this->m_isAsmJsScheduledForFullJIT = false;
        this->m_asmJsTotalLoopCount = 0;

        recentlyBailedOutOfJittedLoopBody = false;

        SetLoopInterpreterLimit(CONFIG_FLAG(LoopInterpretCount));
        ReinitializeExecutionModeAndLimits();

        Assert(this->m_sourceInfo.m_probeCount == 0);
        this->m_sourceInfo.m_probeBackingBlock = nullptr;

#if DBG
        // This could be non-zero if the function threw exception before. Reset it.
        this->m_DEBUG_executionCount = 0;
#endif
        if (this->m_sourceInfo.pSpanSequence != nullptr)
        {
            HeapDelete(this->m_sourceInfo.pSpanSequence);
            this->m_sourceInfo.pSpanSequence = nullptr;
        }

        if (this->m_sourceInfo.m_auxStatementData != nullptr)
        {
            // This must be consistent with how we allocate the data for this and inner structures.
            // We are using recycler, thus it's enough just to set to NULL.
            Assert(m_scriptContext->GetRecycler()->IsValidObject(m_sourceInfo.m_auxStatementData));
            m_sourceInfo.m_auxStatementData = nullptr;
        }
    }